

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::Canceler::AdapterBase::~AdapterBase(AdapterBase *this)

{
  char *in_RSI;
  AdapterBase *this_local;
  
  this->_vptr_AdapterBase = (_func_int **)&PTR___cxa_pure_virtual_00c0d5e0;
  unlink(this,in_RSI);
  return;
}

Assistant:

Canceler::AdapterBase::~AdapterBase() noexcept(false) {
  unlink();
}